

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python-puppet.hpp
# Opt level: O3

PyObject * pybind11_init_impl_pyhenson(void)

{
  handle hVar1;
  handle hVar2;
  cpp_function func;
  unique_function_record unique_rec;
  module_ m;
  handle local_48;
  handle local_40;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_38;
  object local_30;
  handle local_28;
  
  pybind11::module_::create_extension_module
            ((module_ *)&local_28,"pyhenson",(char *)0x0,&pybind11_module_def_pyhenson);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"yield_");
  if (local_40.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_1,void,,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_1&&,void(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 0;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "yield_";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"() -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_1,void,,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_1&&,void(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,0);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"yield_",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"stop");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_2,bool,,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_2&&,bool(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 0;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "stop";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"() -> bool",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_2,bool,,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_2&&,bool(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,0);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"stop",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"get");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_0,pybind11::object,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_0&&,pybind11::object(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 1;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "get";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11_init_pyhenson(pybind11::module_&)::$_0,pybind11::object,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_0&&,pybind11::object(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"get",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"add");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_3,void,std::__cxx11::string,int,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_3&&,void(*)(std::__cxx11::string,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 2;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "add";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}, {int}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_3,void,std::__cxx11::string,int,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_3&&,void(*)(std::__cxx11::string,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"add",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"add");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_4,void,std::__cxx11::string,unsigned_long,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_4&&,void(*)(std::__cxx11::string,unsigned_long),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 2;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "add";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}, {int}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_4,void,std::__cxx11::string,unsigned_long,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_4&&,void(*)(std::__cxx11::string,unsigned_long),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"add",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"add");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_5,void,std::__cxx11::string,float,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_5&&,void(*)(std::__cxx11::string,float),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 2;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "add";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,
             "({str}, {float}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_5,void,std::__cxx11::string,float,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_5&&,void(*)(std::__cxx11::string,float),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"add",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"add");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_6,void,std::__cxx11::string,double,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_6&&,void(*)(std::__cxx11::string,double),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 2;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "add";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,
             "({str}, {float}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_6,void,std::__cxx11::string,double,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_6&&,void(*)(std::__cxx11::string,double),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"add",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"add");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_7,void,std::__cxx11::string,pybind11::array&,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_7&&,void(*)(std::__cxx11::string,pybind11::array&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 2;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "add";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,
             "({str}, {numpy.ndarray}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_7,void,std::__cxx11::string,pybind11::array&,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_7&&,void(*)(std::__cxx11::string,pybind11::array&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"add",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"add");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_8,void,std::__cxx11::string,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_8&&,void(*)(std::__cxx11::string,std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 2;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "add";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}, {str}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_8,void,std::__cxx11::string,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_8&&,void(*)(std::__cxx11::string,std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"add",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"create_queue");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_9,void,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_9&&,void(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 1;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "create_queue";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}) -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_9,void,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_9&&,void(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"create_queue",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"queue_empty");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_10,bool,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_10&&,bool(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 1;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "queue_empty";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}) -> bool",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_10,bool,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_10&&,bool(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"queue_empty",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"exists");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_11,bool,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_11&&,bool(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 1;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "exists";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"({str}) -> bool",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_11,bool,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_11&&,bool(*)(std::__cxx11::string),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"exists",local_48,true);
  pybind11::object::~object((object *)&local_48);
  hVar1.m_ptr = local_28.m_ptr;
  local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_28.m_ptr,"clear");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_40.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_40.m_ptr;
  }
  local_40.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_40.m_ptr;
  local_48.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
  (local_38._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11_init_pyhenson(pybind11::module_&)::$_12,void,,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_12&&,void(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_38._M_head_impl)->nargs_pos = 0;
  (local_38._M_head_impl)->field_0x59 = (local_38._M_head_impl)->field_0x59 & 0x3f;
  (local_38._M_head_impl)->name = "clear";
  ((local_38._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_38._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_48,(unique_function_record *)&local_38,"() -> None",
             (type_info **)
             &pybind11::cpp_function::
              initialize<pybind11_init_pyhenson(pybind11::module_&)::$_12,void,,pybind11::name,pybind11::scope,pybind11::sibling>(pybind11_init_pyhenson(pybind11::module_&)::$_12&&,void(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::types,0);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_38);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_30);
  pybind11::module_::add_object((module_ *)&local_28,"clear",local_48,true);
  pybind11::object::~object((object *)&local_48);
  pybind11::object::~object((object *)&local_28);
  return local_28.m_ptr;
}

Assistant:

PYBIND11_EMBEDDED_MODULE(pyhenson, m)
{
    using namespace henson;

    auto self = []()
    {
        auto self__ = py::module::import("pyhenson").attr("self");
        void* self_ = reinterpret_cast<void*>(self__.cast<intptr_t>());
        PythonPuppet* self = (PythonPuppet*) self_;
        return self;
    };

    auto nm = [self]()
    {
        NameMap*      nm   = self()->namemap_;
        return nm;
    };

    m.def("yield_",     [self]() { self()->yield(); });
    m.def("stop",       [self]() { return self()->stop_ != 0; });

    m.def("get",        [nm](std::string name) -> py::object
                        {
                            struct extract_array
                            {
                                py::object   operator()(float* a) const     { return py::array_t<float>({ count }, { stride }, a); }
                                py::object   operator()(double* a) const    { return py::array_t<double>({ count }, { stride }, a); }
                                py::object   operator()(int* a) const       { return py::array_t<int>({ count }, { stride }, a); }
                                py::object   operator()(long* a) const      { return py::array_t<long>({ count }, { stride }, a); }
                                py::object   operator()(void*) const        { throw py::cast_error("Cannot convert void* array to NumPy"); }

                                size_t count;
                                size_t stride;
                            };

                            struct extract
                            {
                                py::object operator()(int x) const      { return py::int_(x); }
                                py::object operator()(size_t x) const   { return py::int_(x); }
                                py::object operator()(float x) const    { return py::float_(x); }
                                py::object operator()(double x) const   { return py::float_(x); }
                                py::object operator()(void* x) const    { throw  py::cast_error("Cannot return void* to Python"); }
                                py::object operator()(Array a) const    { return visit(extract_array { a.count, a.stride }, a.address); }
                                py::object operator()(std::string x) const   { return py::str(x); }
                            };
                            return visit(extract{}, nm()->get(name));
                        });
    m.def("add",        [nm](std::string name, int    x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, size_t x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, float  x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, double x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, py::array& x)
    {
        Value v;
        if (x.dtype().is(py::dtype::of<float>()))
            v = henson::Array(static_cast<float*>(x.mutable_data()), sizeof(float), x.size(), x.strides(0));
        else if (x.dtype().is(py::dtype::of<double>()))
            v = henson::Array(static_cast<double*>(x.mutable_data()), sizeof(double), x.size(), x.strides(0));
        else if (x.dtype().is(py::dtype::of<int>()))
            v = henson::Array(static_cast<int*>(x.mutable_data()), sizeof(int), x.size(), x.strides(0));
        else if (x.dtype().is(py::dtype::of<long>()))
            v = henson::Array(static_cast<long*>(x.mutable_data()), sizeof(long), x.size(), x.strides(0));
        else
            throw std::runtime_error("Unknown array dtype");

        nm()->add(name, v);
    });
    m.def("add",        [nm](std::string name, std::string x)    { Value v = x; nm()->add(name, v); });

    m.def("create_queue",   [nm](std::string name)          { nm()->create_queue(name); });
    m.def("queue_empty",    [nm](std::string name)          { return nm()->queue_empty(name); });

    m.def("exists",     [nm](std::string name)      { return nm()->exists(name); });
    m.def("clear",      [nm]()                      { nm()->clear(); });
}